

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O3

void __thiscall liblogger::LogUnixServer::LogUnixServer(LogUnixServer *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  LogException *pLVar6;
  stringstream ss;
  string local_248;
  undefined1 local_228 [34];
  undefined8 local_206;
  undefined8 uStack_1fe;
  undefined8 local_1f6;
  undefined8 uStack_1ee;
  undefined8 local_1e6;
  undefined8 uStack_1de;
  undefined8 uStack_1d6;
  undefined4 uStack_1ce;
  undefined4 local_1ca;
  undefined4 uStack_1c6;
  undefined8 uStack_1c2;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogUnixServer_001449e8;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&this->m_list;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&this->m_list;
  (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_path,pcVar1,pcVar1 + path->_M_string_length);
  this->m_acceptfd = -1;
  this->m_ctlfd[0] = -1;
  this->m_running = false;
  this->m_ctlfd[1] = -1;
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    abort();
  }
  unlink((this->m_path)._M_dataplus._M_p);
  iVar2 = socket(1,1,0);
  this->m_acceptfd = iVar2;
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot create socket: ",0x16);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(local_1a8,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,(string *)local_228);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  iVar2 = socketpair(1,1,0,this->m_ctlfd);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot create ctlfd: ",0x15);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(local_1a8,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,(string *)local_228);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  uStack_1c6 = 0;
  uStack_1c2 = 0;
  uStack_1d6 = 0;
  uStack_1ce = 0;
  local_1ca = 0;
  local_1e6 = 0;
  uStack_1de = 0;
  local_1f6 = 0;
  uStack_1ee = 0;
  local_206 = 0;
  uStack_1fe = 0;
  local_228._18_8_ = 0;
  local_228._26_8_ = 0;
  local_228[2] = '\0';
  local_228[3] = '\0';
  local_228[4] = '\0';
  local_228[5] = '\0';
  local_228[6] = '\0';
  local_228[7] = '\0';
  local_228[8] = '\0';
  local_228[9] = '\0';
  local_228._10_8_ = 0;
  local_228._0_2_ = 1;
  snprintf(local_228 + 2,0x6c,"%s",(this->m_path)._M_dataplus._M_p);
  iVar2 = bind(this->m_acceptfd,(sockaddr *)local_228,0x6e);
  if (-1 < iVar2) {
    iVar2 = listen(this->m_acceptfd,0xf);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot listen on path: ",0x17);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->m_path)._M_dataplus._M_p,(this->m_path)._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," error: ",8);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      std::operator<<(poVar3,pcVar5);
      pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar6,&local_248);
      __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
    }
    iVar2 = pthread_create(&this->m_thread,(pthread_attr_t *)0x0,Run,this);
    if (iVar2 == 0) {
      this->m_running = true;
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot start thread: ",0x15);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(local_1a8,pcVar5);
    pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar6,&local_248);
    __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot bind to path: ",0x15);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_path)._M_dataplus._M_p,(this->m_path)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," error: ",8);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(poVar3,pcVar5);
  pLVar6 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar6,&local_248);
  __cxa_throw(pLVar6,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogUnixServer::LogUnixServer(const std::string &path) :
	m_path(path),
	m_acceptfd(-1),
	m_running(false)
{
	m_ctlfd[0] = -1;
	m_ctlfd[1] = -1;

	try
	{
		if (pthread_mutex_init(&m_mutex, NULL) != 0)
			abort();

		unlink(m_path.c_str());
		m_acceptfd = socket(AF_UNIX, SOCK_STREAM, 0);
		if (m_acceptfd < 0)
		{
			std::stringstream ss;
			ss << "Cannot create socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (socketpair(AF_LOCAL, SOCK_STREAM, 0, m_ctlfd) != 0)
		{
			std::stringstream ss;
			ss << "Cannot create ctlfd: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Bind etc..
		struct sockaddr_un serv_addr;
		socklen_t sockaddr_len = sizeof(serv_addr);
		memset(&serv_addr, 0, sizeof(serv_addr));
		serv_addr.sun_family = AF_UNIX;
		snprintf(serv_addr.sun_path, sizeof(serv_addr.sun_path), "%s", m_path.c_str());

		if (bind(m_acceptfd, (struct sockaddr *) &serv_addr, sockaddr_len) < 0)
		{
			std::stringstream ss;
			ss << "Cannot bind to path: " << m_path << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (listen(m_acceptfd, 15) < 0)
		{
			std::stringstream ss;
			ss << "Cannot listen on path: " << m_path << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Create thread
		if (pthread_create(&m_thread, NULL, LogUnixServer::Run, this) != 0)
		{
			std::stringstream ss;
			ss << "Cannot start thread: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_running = true;

	} catch(std::exception &ex)
	{
		if (m_acceptfd >= 0)
		{
			if (close(m_acceptfd) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[0] >= 0)
		{
			if (close(m_ctlfd[0]) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[1] >= 0)
		{
			if (close(m_ctlfd[1]) < 0)
			{
				abort();
			}
		}

		throw(ex);
	}
}